

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.h
# Opt level: O2

void __thiscall
Population::Population(Population *this,int amount,string *modelName,Parameters *param)

{
  bool bVar1;
  iaf_psc_alpha *piVar2;
  int iVar3;
  iaf_psc_alpha *local_48;
  vector<Neuron*,std::allocator<Neuron*>> *local_40;
  Population *local_38;
  
  this->_vptr_Population = (_func_int **)&PTR_update_00111990;
  (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = (vector<Neuron*,std::allocator<Neuron*>> *)&this->neurons;
  (this->neurons).super__Vector_base<Neuron_*,_std::allocator<Neuron_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->neurons).super__Vector_base<Neuron_*,_std::allocator<Neuron_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->neurons).super__Vector_base<Neuron_*,_std::allocator<Neuron_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->numberOfNeurons = amount;
  this->numberOfOutputNeurons = amount;
  this->numberOfInputNeurons = amount;
  local_38 = this;
  initialize(this);
  bVar1 = std::operator==(modelName,"iaf");
  if (bVar1) {
    iVar3 = 0;
    if (0 < amount) {
      iVar3 = amount;
    }
    while (iVar3 != 0) {
      piVar2 = (iaf_psc_alpha *)operator_new(0x50);
      LIF::LIF((LIF *)piVar2,(LIF_param *)param);
      local_48 = piVar2;
      std::vector<Neuron*,std::allocator<Neuron*>>::emplace_back<Neuron*>
                (local_40,(Neuron **)&local_48);
      iVar3 = iVar3 + -1;
    }
  }
  else {
    bVar1 = std::operator==(modelName,"izhikevich");
    if (bVar1) {
      iVar3 = 0;
      if (amount < 1) {
        amount = 0;
      }
      for (; amount != iVar3; iVar3 = iVar3 + 1) {
        piVar2 = (iaf_psc_alpha *)operator_new(0x60);
        Izhikevich::Izhikevich((Izhikevich *)piVar2,(long)local_38,iVar3,(Izhikevich_param *)param);
        local_48 = piVar2;
        std::vector<Neuron*,std::allocator<Neuron*>>::emplace_back<Neuron*>
                  (local_40,(Neuron **)&local_48);
      }
    }
    else {
      bVar1 = std::operator==(modelName,"CurrentGenerator");
      if (bVar1) {
        iVar3 = 0;
        if (0 < amount) {
          iVar3 = amount;
        }
        while (iVar3 != 0) {
          piVar2 = (iaf_psc_alpha *)operator_new(0x60);
          CurrentGenerator::CurrentGenerator
                    ((CurrentGenerator *)piVar2,(CurrentGenerator_param *)param);
          local_48 = piVar2;
          std::vector<Neuron*,std::allocator<Neuron*>>::emplace_back<Neuron*>
                    (local_40,(Neuron **)&local_48);
          iVar3 = iVar3 + -1;
        }
      }
      else {
        bVar1 = std::operator==(modelName,"SignalGenerator");
        if (bVar1) {
          iVar3 = 0;
          if (0 < amount) {
            iVar3 = amount;
          }
          while (iVar3 != 0) {
            piVar2 = (iaf_psc_alpha *)operator_new(0x60);
            SignalGenerator::SignalGenerator
                      ((SignalGenerator *)piVar2,(SignalGenerator_param *)param);
            local_48 = piVar2;
            std::vector<Neuron*,std::allocator<Neuron*>>::emplace_back<Neuron*>
                      (local_40,(Neuron **)&local_48);
            iVar3 = iVar3 + -1;
          }
        }
        else {
          bVar1 = std::operator==(modelName,"PassThrough");
          if (bVar1) {
            iVar3 = 0;
            if (0 < amount) {
              iVar3 = amount;
            }
            while (iVar3 != 0) {
              piVar2 = (iaf_psc_alpha *)operator_new(0x48);
              PassThrough::PassThrough((PassThrough *)piVar2,(PassThrough_param *)param);
              local_48 = piVar2;
              std::vector<Neuron*,std::allocator<Neuron*>>::emplace_back<Neuron*>
                        (local_40,(Neuron **)&local_48);
              iVar3 = iVar3 + -1;
            }
          }
          else {
            bVar1 = std::operator==(modelName,"iaf_psc_alpha");
            if (bVar1) {
              iVar3 = 0;
              if (amount < 1) {
                amount = 0;
              }
              for (; amount != iVar3; iVar3 = iVar3 + 1) {
                piVar2 = (iaf_psc_alpha *)operator_new(0x118);
                iaf_psc_alpha::iaf_psc_alpha
                          (piVar2,(long)local_38,iVar3,(iaf_psc_alpha_param *)param);
                local_48 = piVar2;
                std::vector<Neuron*,std::allocator<Neuron*>>::emplace_back<Neuron*>
                          (local_40,(Neuron **)&local_48);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

Population(int amount, std::string modelName, Parameters* param) {
        numberOfNeurons = amount;
        numberOfOutputNeurons = numberOfOutputNeurons == 0? amount : numberOfOutputNeurons;
        numberOfInputNeurons = numberOfInputNeurons == 0? amount : numberOfInputNeurons;
        initialize();
        if(modelName == "iaf") {
            for(int i = 0; i < amount; i++) {
                neurons.push_back(new LIF(static_cast<LIF_param*>(param)));
            }
        }
        else if(modelName == "izhikevich") {
            for(int i = 0; i < amount; i++) {
                neurons.push_back(new Izhikevich((long)this, i, static_cast<Izhikevich_param*>(param)));
            }
        }
        else if(modelName == "CurrentGenerator") {
            for(int i = 0; i < amount; i++) {
                neurons.push_back(new CurrentGenerator(static_cast<CurrentGenerator_param*>(param)));
            }
        }
        else if(modelName == "SignalGenerator") {
            for(int i = 0; i < amount; i++) {
                neurons.push_back(new SignalGenerator(static_cast<SignalGenerator_param*>(param)));
            }
        }
        else if(modelName == "PassThrough") {
            for(int i = 0; i < amount; i++) {
                neurons.push_back(new PassThrough(static_cast<PassThrough_param*>(param)));
            }
        }
        else if(modelName == "iaf_psc_alpha") {
            for(int i = 0; i < amount; i++) {
                neurons.push_back(new iaf_psc_alpha((long)this, i, static_cast<iaf_psc_alpha_param*>(param)));
            }
        }
        else {
            // TODOS throw exception
        }
    }